

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O3

PHYSFS_sint64 PHYSFS_readBytes(PHYSFS_File *handle,void *buffer,PHYSFS_uint64 _len)

{
  size_t sVar1;
  PHYSFS_uint64 _len_00;
  PHYSFS_ErrorCode errcode;
  ulong __n;
  PHYSFS_sint64 PVar2;
  
  if ((handle->opaque == (void *)0x0) &&
     (handle = (PHYSFS_File *)magicStream, magicStream == (FileHandle *)0x0)) {
    errcode = PHYSFS_ERR_IO;
  }
  else if ((long)_len < 0) {
    errcode = PHYSFS_ERR_INVALID_ARGUMENT;
  }
  else {
    if (((FileHandle *)handle)->forReading != '\0') {
      if (_len == 0) {
        return 0;
      }
      if (((FileHandle *)handle)->buffer != (PHYSFS_uint8 *)0x0) {
        sVar1 = ((FileHandle *)handle)->bufpos;
        PVar2 = 0;
        do {
          __n = ((FileHandle *)handle)->buffill - sVar1;
          if (__n == 0) {
            sVar1 = (*((FileHandle *)handle)->io->read)
                              (((FileHandle *)handle)->io,((FileHandle *)handle)->buffer,
                               ((FileHandle *)handle)->bufsize);
            ((FileHandle *)handle)->bufpos = 0;
            if ((long)sVar1 < 1) {
              ((FileHandle *)handle)->buffill = 0;
              if (PVar2 != 0) {
                return PVar2;
              }
              return sVar1;
            }
            ((FileHandle *)handle)->buffill = sVar1;
            sVar1 = 0;
          }
          else {
            if (_len < __n) {
              __n = _len;
            }
            memcpy(buffer,((FileHandle *)handle)->buffer + sVar1,__n);
            buffer = (void *)((long)buffer + __n);
            _len = _len - __n;
            sVar1 = ((FileHandle *)handle)->bufpos + __n;
            ((FileHandle *)handle)->bufpos = sVar1;
            PVar2 = PVar2 + __n;
          }
        } while (_len != 0);
        return PVar2;
      }
      _len_00 = (*((FileHandle *)handle)->io->read)(((FileHandle *)handle)->io,buffer,_len);
      if (magicStream == (FileHandle *)0x0) {
        return _len_00;
      }
      if (_len_00 == 0xffffffffffffffff || magicStream->forReading != '\0') {
        return _len_00;
      }
      PHYSFS_writeBytes((PHYSFS_File *)magicStream,buffer,_len_00);
      return _len_00;
    }
    errcode = PHYSFS_ERR_OPEN_FOR_WRITING;
  }
  PHYSFS_setErrorCode(errcode);
  return -1;
}

Assistant:

PHYSFS_sint64 PHYSFS_readBytes(PHYSFS_File *handle, void *buffer,
                               PHYSFS_uint64 _len)
{
    PHYSFS_sint64 retval;
    const size_t len = (size_t) _len;
    FileHandle *fh = (FileHandle *) handle;

    if (fh->io == NULL)
    {
        BAIL_IF(magicStream == NULL, PHYSFS_ERR_IO, -1);
        fh = magicStream;
    }

#ifdef PHYSFS_NO_64BIT_SUPPORT
    const PHYSFS_uint64 maxlen = __PHYSFS_UI64(0x7FFFFFFF);
#else
    const PHYSFS_uint64 maxlen = __PHYSFS_UI64(0x7FFFFFFFFFFFFFFF);
#endif

    if (!__PHYSFS_ui64FitsAddressSpace(_len))
        BAIL(PHYSFS_ERR_INVALID_ARGUMENT, -1);

    BAIL_IF(_len > maxlen, PHYSFS_ERR_INVALID_ARGUMENT, -1);
    BAIL_IF(!fh->forReading, PHYSFS_ERR_OPEN_FOR_WRITING, -1);
    BAIL_IF_ERRPASS(len == 0, 0);

    if (fh->buffer)
        return doBufferedRead(fh, buffer, len);

    retval = fh->io->read(fh->io, buffer, len);

    /* complete failure at read will mess up the magic stream.. */
    if (magicStream && !magicStream->forReading && retval != -1)
        PHYSFS_writeBytes((PHYSFS_File *)magicStream, buffer, retval);

    return retval;
}